

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockaction.cc
# Opt level: O0

FlowBlock * __thiscall
FloatingEdge::getCurrentEdge(FloatingEdge *this,int4 *outedge,FlowBlock *graph)

{
  int4 iVar1;
  FlowBlock *pFVar2;
  FlowBlock *graph_local;
  int4 *outedge_local;
  FloatingEdge *this_local;
  
  while (pFVar2 = FlowBlock::getParent(this->top), pFVar2 != graph) {
    pFVar2 = FlowBlock::getParent(this->top);
    this->top = pFVar2;
  }
  while (pFVar2 = FlowBlock::getParent(this->bottom), pFVar2 != graph) {
    pFVar2 = FlowBlock::getParent(this->bottom);
    this->bottom = pFVar2;
  }
  iVar1 = FlowBlock::getOutIndex(this->top,this->bottom);
  *outedge = iVar1;
  if (*outedge < 0) {
    this_local = (FloatingEdge *)0x0;
  }
  else {
    this_local = (FloatingEdge *)this->top;
  }
  return (FlowBlock *)this_local;
}

Assistant:

FlowBlock *FloatingEdge::getCurrentEdge(int4 &outedge,FlowBlock *graph)

{
  while(top->getParent() != graph)
    top = top->getParent();	// Move up through collapse hierarchy to current graph
  while(bottom->getParent() != graph)
    bottom = bottom->getParent();
  outedge = top->getOutIndex(bottom);
  if (outedge < 0)
    return (FlowBlock *)0;	// Edge does not exist (any longer)
  return top;
}